

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern.c
# Opt level: O2

int xmlStreamCtxtAddState(xmlStreamCtxtPtr comp,int idx,int level)

{
  int iVar1;
  int *piVar2;
  uint uVar3;
  ulong uVar4;
  ulong uStack_20;
  
  uVar3 = comp->nbState;
  uStack_20 = 0;
  uVar4 = 0;
  if (0 < (int)uVar3) {
    uVar4 = (ulong)uVar3;
  }
  for (; uVar4 != uStack_20; uStack_20 = uStack_20 + 1) {
    piVar2 = comp->states;
    if (piVar2[uStack_20 * 2] < 0) {
      piVar2[uStack_20 * 2] = idx;
      piVar2[uStack_20 * 2 + 1] = level;
      goto LAB_0016a25f;
    }
  }
  piVar2 = comp->states;
  if (comp->maxState <= (int)uVar3) {
    piVar2 = (int *)(*xmlRealloc)(piVar2,(long)comp->maxState << 4);
    if (piVar2 == (int *)0x0) {
      uStack_20 = 0xffffffffffffffff;
      goto LAB_0016a25f;
    }
    comp->states = piVar2;
    comp->maxState = comp->maxState << 1;
    uVar3 = comp->nbState;
  }
  piVar2[(int)(uVar3 * 2)] = idx;
  iVar1 = comp->nbState;
  comp->nbState = iVar1 + 1;
  piVar2[(long)iVar1 * 2 + 1] = level;
  uStack_20 = (ulong)(comp->nbState - 1);
LAB_0016a25f:
  return (int)uStack_20;
}

Assistant:

static int
xmlStreamCtxtAddState(xmlStreamCtxtPtr comp, int idx, int level) {
    int i;
    for (i = 0;i < comp->nbState;i++) {
        if (comp->states[2 * i] < 0) {
	    comp->states[2 * i] = idx;
	    comp->states[2 * i + 1] = level;
	    return(i);
	}
    }
    if (comp->nbState >= comp->maxState) {
        int *cur;

	cur = (int *) xmlRealloc(comp->states,
				 comp->maxState * 4 * sizeof(int));
	if (cur == NULL) {
	    ERROR(NULL, NULL, NULL,
		  "xmlNewStreamCtxt: malloc failed\n");
	    return(-1);
	}
	comp->states = cur;
        comp->maxState *= 2;
    }
    comp->states[2 * comp->nbState] = idx;
    comp->states[2 * comp->nbState++ + 1] = level;
    return(comp->nbState - 1);
}